

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

CZString * __thiscall Json::Value::CZString::operator=(CZString *this,CZString *other)

{
  ArrayIndex AVar1;
  char *pcVar2;
  CZString temp;
  CZString local_20;
  
  CZString(&local_20,other);
  pcVar2 = this->cstr_;
  this->cstr_ = local_20.cstr_;
  AVar1 = this->index_;
  this->index_ = local_20.index_;
  local_20.cstr_ = pcVar2;
  local_20.index_ = AVar1;
  ~CZString(&local_20);
  return this;
}

Assistant:

Value::CZString &
Value::CZString::operator =( const CZString &other )
{
   CZString temp( other );
   swap( temp );
   return *this;
}